

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

bool __thiscall cmCTestSVN::NoteOldRevision(cmCTestSVN *this)

{
  _List_node_base *this_00;
  cmCTest *this_01;
  SVNInfo *svninfo;
  bool bVar1;
  ostream *poVar2;
  _List_node_base *p_Var3;
  char *local_1c8 [4];
  ostringstream cmCTestLog_msg;
  
  bVar1 = LoadRepositories(this);
  if (bVar1) {
    p_Var3 = (_List_node_base *)&this->Repositories;
    while (p_Var3 = (((_List_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_> *)
                     &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var3 != (_List_node_base *)&this->Repositories) {
      svninfo = (SVNInfo *)(p_Var3 + 1);
      LoadInfo_abi_cxx11_((string *)&cmCTestLog_msg,this,svninfo);
      this_00 = p_Var3 + 9;
      std::__cxx11::string::operator=((string *)this_00,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      poVar2 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                               "Revision for repository \'");
      poVar2 = std::operator<<(poVar2,(string *)svninfo);
      poVar2 = std::operator<<(poVar2,"\' before update: ");
      poVar2 = std::operator<<(poVar2,(string *)this_00);
      std::operator<<(poVar2,"\n");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,
                               "   Old revision of external repository \'");
      poVar2 = std::operator<<(poVar2,(string *)svninfo);
      poVar2 = std::operator<<(poVar2,"\' is: ");
      poVar2 = std::operator<<(poVar2,(string *)this_00);
      std::operator<<(poVar2,"\n");
      this_01 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(this_01,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSVN.cxx"
                   ,0x72,local_1c8[0],false);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).OldRevision);
    std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev);
  }
  return bVar1;
}

Assistant:

bool cmCTestSVN::NoteOldRevision()
{
  if (!this->LoadRepositories()) {
    return false;
  }

  for (SVNInfo& svninfo : this->Repositories) {
    svninfo.OldRevision = this->LoadInfo(svninfo);
    this->Log << "Revision for repository '" << svninfo.LocalPath
              << "' before update: " << svninfo.OldRevision << "\n";
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   Old revision of external repository '"
                 << svninfo.LocalPath << "' is: " << svninfo.OldRevision
                 << "\n");
  }

  // Set the global old revision to the one of the root
  this->OldRevision = this->RootInfo->OldRevision;
  this->PriorRev.Rev = this->OldRevision;
  return true;
}